

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_frequencies.c
# Opt level: O3

void CGTFS_RecordFrequency(void)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  frequency_t *pfVar4;
  undefined4 *puVar5;
  byte bVar6;
  frequency_t a;
  char *field_values [5];
  char *field_names [5];
  frequency_t local_124;
  undefined1 local_c8 [16];
  char *local_b8;
  char *pcStack_b0;
  char *local_a8;
  undefined1 local_68 [16];
  char *local_58;
  char *pcStack_50;
  char *local_48;
  
  bVar6 = 0;
  iVar1 = greatest_test_pre("frequency_read");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      local_48 = "exact_times";
      local_58 = "end_time";
      pcStack_50 = "headway_secs";
      local_68._0_8_ = "trip_id";
      local_68._8_8_ = "start_time";
      local_a8 = "";
      local_b8 = "07:00:00";
      pcStack_b0 = "1200";
      local_c8._0_8_ = "0xC0FFEE";
      local_c8._8_8_ = "05:00:00";
      read_frequency(&local_124,5,(char **)local_68,(char **)local_c8);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = greatest_do_assert_equal_t
                        ("0xC0FFEE",&local_124,&greatest_type_info_string,(void *)0x0);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x13;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
LAB_00121379:
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "\"0xC0FFEE\" != freq_1.trip_id";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = greatest_do_assert_equal_t
                          ("05:00:00",local_124.start_time,&greatest_type_info_string,(void *)0x0);
        if (iVar1 == 0) {
          greatest_info.fail_line = 0x14;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00121379;
          greatest_info.msg = "\"05:00:00\" != freq_1.start_time";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar1 = greatest_do_assert_equal_t
                            ("07:00:00",local_124.end_time,&greatest_type_info_string,(void *)0x0);
          if (iVar1 == 0) {
            greatest_info.fail_line = 0x15;
            if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00121379;
            greatest_info.msg = "\"07:00:00\" != freq_1.end_time";
          }
          else if (local_124.headway_secs == 0x4b0) {
            greatest_info.assertions = greatest_info.assertions + 2;
            if (local_124.exact_times == TE_NOT_EXACT) {
              greatest_info.msg = (char *)0x0;
              iVar1 = 0;
              goto LAB_001213bc;
            }
            greatest_info.fail_line = 0x17;
            greatest_info.msg = "TE_NOT_EXACT != freq_1.exact_times";
          }
          else {
            greatest_info.fail_line = 0x16;
            greatest_info.msg = "1200 != freq_1.headway_secs";
            greatest_info.assertions = greatest_info.assertions + 1;
          }
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_frequencies.c"
      ;
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_0012151d;
    }
LAB_001213bc:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("frequency_compare");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    pcVar3 = "EXAMPLEtrip";
    pfVar4 = &local_124;
    for (lVar2 = 0x17; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined4 *)pfVar4->trip_id = *(undefined4 *)pcVar3;
      pcVar3 = pcVar3 + ((ulong)bVar6 * -2 + 1) * 4;
      pfVar4 = (frequency_t *)((long)pfVar4 + (ulong)bVar6 * -8 + 4);
    }
    pcVar3 = "EXAMPLEtrip";
    pfVar4 = (frequency_t *)local_68;
    for (lVar2 = 0x17; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined4 *)pfVar4->trip_id = *(undefined4 *)pcVar3;
      pcVar3 = pcVar3 + ((ulong)bVar6 * -2 + 1) * 4;
      pfVar4 = (frequency_t *)((long)pfVar4 + (ulong)bVar6 * -8 + 4);
    }
    pcVar3 = "EXAMPLEtrip";
    puVar5 = (undefined4 *)local_c8;
    for (lVar2 = 0x17; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar5 = *(undefined4 *)pcVar3;
      pcVar3 = pcVar3 + ((ulong)bVar6 * -2 + 1) * 4;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_frequency(&local_124,(frequency_t *)local_68);
    if (iVar1 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_frequency(&local_124,(frequency_t *)local_c8);
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_frequency((frequency_t *)local_68,(frequency_t *)local_c8);
        if (iVar1 == 0) {
          greatest_info.msg = (char *)0x0;
          iVar1 = 0;
          goto LAB_001214b1;
        }
        greatest_info.fail_line = 0x37;
        greatest_info.msg = "0 != equal_frequency(&b, &c)";
      }
      else {
        greatest_info.fail_line = 0x36;
        greatest_info.msg = "0 != equal_frequency(&a, &c)";
      }
    }
    else {
      greatest_info.fail_line = 0x35;
      greatest_info.msg = "1 != equal_frequency(&a, &b)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_frequencies.c"
    ;
    iVar1 = -1;
    if ((greatest_info.flags & 4) != 0) {
LAB_0012151d:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_frequencies.c"
      ;
      abort();
    }
  }
LAB_001214b1:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_RecordFrequency) {
    RUN_TEST(frequency_read);
    RUN_TEST(frequency_compare);
}